

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_document_add_mapping(yaml_document_t *document,yaml_char_t *tag,yaml_mapping_style_t style)

{
  yaml_node_t *__dest;
  int iVar1;
  size_t length;
  yaml_char_t *pyVar2;
  undefined4 local_c0 [2];
  yaml_node_t node;
  anon_struct_24_3_654a3493 pairs;
  yaml_char_t *tag_copy;
  yaml_mark_t mark;
  anon_struct_4_1_a7dec128 context;
  yaml_mapping_style_t style_local;
  yaml_char_t *tag_local;
  yaml_document_t *document_local;
  
  mark.column._4_4_ = style;
  memset(&tag_copy,0,0x18);
  pairs.top = (yaml_node_pair_t *)0x0;
  memset(&node.end_mark.column,0,0x18);
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/libyaml/src/api.c"
                  ,0x519,
                  "int yaml_document_add_mapping(yaml_document_t *, yaml_char_t *, yaml_mapping_style_t)"
                 );
  }
  _context = (char *)tag;
  if (tag == (yaml_char_t *)0x0) {
    _context = "tag:yaml.org,2002:map";
  }
  length = strlen(_context);
  iVar1 = yaml_check_utf8((yaml_char_t *)_context,length);
  if ((iVar1 != 0) &&
     (pairs.top = (yaml_node_pair_t *)yaml_strdup((yaml_char_t *)_context),
     pairs.top != (yaml_node_pair_t *)0x0)) {
    node.end_mark.column = (size_t)yaml_malloc(0x80);
    if ((void *)node.end_mark.column == (void *)0x0) {
      mark.column._0_4_ = 1;
    }
    else {
      pyVar2 = (yaml_char_t *)(node.end_mark.column + 0x80);
      memset(local_c0,0,0x60);
      local_c0[0] = 3;
      node.data._24_8_ = tag_copy;
      node.start_mark.index = mark.index;
      node.start_mark.line = mark.line;
      node.start_mark.column = (size_t)tag_copy;
      node.end_mark.index = mark.index;
      node.end_mark.line = mark.line;
      node.tag = (yaml_char_t *)node.end_mark.column;
      node.data.scalar.length = node.end_mark.column;
      node.data.scalar.style = mark.column._4_4_;
      node._0_8_ = pairs.top;
      node.data.scalar.value = pyVar2;
      if (((document->nodes).top != (document->nodes).end) ||
         (iVar1 = yaml_stack_extend((void **)document,&(document->nodes).top,&(document->nodes).end)
         , iVar1 != 0)) {
        __dest = (document->nodes).top;
        (document->nodes).top = __dest + 1;
        memcpy(__dest,local_c0,0x60);
        return (int)(((long)(document->nodes).top - (long)(document->nodes).start) / 0x60);
      }
      mark.column._0_4_ = 1;
    }
  }
  yaml_free((void *)node.end_mark.column);
  node.end_mark.column = 0;
  yaml_free(pairs.top);
  return 0;
}

Assistant:

YAML_DECLARE(int)
yaml_document_add_mapping(yaml_document_t *document,
        yaml_char_t *tag, yaml_mapping_style_t style)
{
    struct {
        yaml_error_type_t error;
    } context;
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *tag_copy = NULL;
    struct {
        yaml_node_pair_t *start;
        yaml_node_pair_t *end;
        yaml_node_pair_t *top;
    } pairs = { NULL, NULL, NULL };
    yaml_node_t node;

    assert(document);   /* Non-NULL document object is expected. */

    if (!tag) {
        tag = (yaml_char_t *)YAML_DEFAULT_MAPPING_TAG;
    }

    if (!yaml_check_utf8(tag, strlen((char *)tag))) goto error;
    tag_copy = yaml_strdup(tag);
    if (!tag_copy) goto error;

    if (!STACK_INIT(&context, pairs, yaml_node_pair_t*)) goto error;

    MAPPING_NODE_INIT(node, tag_copy, pairs.start, pairs.end,
            style, mark, mark);
    if (!PUSH(&context, document->nodes, node)) goto error;

    return document->nodes.top - document->nodes.start;

error:
    STACK_DEL(&context, pairs);
    yaml_free(tag_copy);

    return 0;
}